

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

void luaG_ordererror(lua_State *L,TValue *p1,TValue *p2)

{
  int iVar1;
  char *__s1;
  char *__s2;
  
  __s1 = luaT_objtypename(L,p1);
  __s2 = luaT_objtypename(L,p2);
  iVar1 = strcmp(__s1,__s2);
  if (iVar1 == 0) {
    luaG_runerror(L,"attempt to compare two %s values",__s1);
  }
  luaG_runerror(L,"attempt to compare %s with %s",__s1,__s2);
}

Assistant:

l_noret luaG_ordererror (lua_State *L, const TValue *p1, const TValue *p2) {
  const char *t1 = luaT_objtypename(L, p1);
  const char *t2 = luaT_objtypename(L, p2);
  if (strcmp(t1, t2) == 0)
    luaG_runerror(L, "attempt to compare two %s values", t1);
  else
    luaG_runerror(L, "attempt to compare %s with %s", t1, t2);
}